

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall
ImVector<ImGuiStackLevelInfo>::resize
          (ImVector<ImGuiStackLevelInfo> *this,int new_size,ImGuiStackLevelInfo *v)

{
  ImGuiStackLevelInfo *pIVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  
  iVar11 = this->Capacity;
  if (iVar11 < new_size) {
    if (iVar11 == 0) {
      iVar11 = 8;
    }
    else {
      iVar11 = iVar11 / 2 + iVar11;
    }
    if (iVar11 <= new_size) {
      iVar11 = new_size;
    }
    reserve(this,iVar11);
  }
  lVar9 = (long)this->Size;
  if (this->Size < new_size) {
    lVar10 = lVar9 << 6;
    for (; lVar9 < new_size; lVar9 = lVar9 + 1) {
      pIVar1 = this->Data;
      uVar2 = *(undefined8 *)v;
      uVar3 = *(undefined8 *)(v->Desc + 1);
      uVar4 = *(undefined8 *)(v->Desc + 9);
      uVar5 = *(undefined8 *)(v->Desc + 0x11);
      uVar6 = *(undefined8 *)(v->Desc + 0x19);
      uVar7 = *(undefined8 *)(v->Desc + 0x21);
      uVar8 = *(undefined8 *)(v->Desc + 0x31);
      *(undefined8 *)(pIVar1->Desc + lVar10 + 0x29) = *(undefined8 *)(v->Desc + 0x29);
      *(undefined8 *)(pIVar1->Desc + lVar10 + 0x29 + 8) = uVar8;
      *(undefined8 *)(pIVar1->Desc + lVar10 + 0x19) = uVar6;
      *(undefined8 *)(pIVar1->Desc + lVar10 + 0x19 + 8) = uVar7;
      *(undefined8 *)(pIVar1->Desc + lVar10 + 9) = uVar4;
      *(undefined8 *)(pIVar1->Desc + lVar10 + 9 + 8) = uVar5;
      *(undefined8 *)(pIVar1->Desc + lVar10 + -7) = uVar2;
      *(undefined8 *)(pIVar1->Desc + lVar10 + -7 + 8) = uVar3;
      lVar10 = lVar10 + 0x40;
    }
  }
  this->Size = new_size;
  return;
}

Assistant:

inline void         resize(int new_size, const T& v)    { if (new_size > Capacity) reserve(_grow_capacity(new_size)); if (new_size > Size) for (int n = Size; n < new_size; n++) memcpy(&Data[n], &v, sizeof(v)); Size = new_size; }